

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_analyze.cpp
# Opt level: O0

void __thiscall front::syntax::SyntaxAnalyze::gm_assign_stmt(SyntaxAnalyze *this)

{
  element_type *peVar1;
  variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__t;
  long in_RDI;
  RightVal *unaff_retaddr;
  LeftVal *in_stack_00000008;
  irGenerator *in_stack_00000010;
  Token in_stack_0000002c;
  SyntaxAnalyze *in_stack_00000030;
  SyntaxAnalyze *in_stack_00000048;
  RightVal rightValue;
  SharedExNdPtr rVal;
  SharedExNdPtr lVal;
  ValueMode in_stack_00000b44;
  SyntaxAnalyze *in_stack_00000b48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffeb8;
  variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_fffffffffffffec0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff08;
  variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_ffffffffffffff10;
  
  std::shared_ptr<front::express::ExpressNode>::shared_ptr
            ((shared_ptr<front::express::ExpressNode> *)0x2ad889);
  std::shared_ptr<front::express::ExpressNode>::shared_ptr
            ((shared_ptr<front::express::ExpressNode> *)0x2ad896);
  std::
  variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::variant((variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)0x2ad8a3);
  gm_l_val(in_stack_00000b48,in_stack_00000b44);
  std::shared_ptr<front::express::ExpressNode>::operator=
            ((shared_ptr<front::express::ExpressNode> *)in_stack_fffffffffffffec0,
             (shared_ptr<front::express::ExpressNode> *)in_stack_fffffffffffffeb8);
  std::shared_ptr<front::express::ExpressNode>::~shared_ptr
            ((shared_ptr<front::express::ExpressNode> *)0x2ad8e0);
  match_one_word(in_stack_00000030,in_stack_0000002c);
  gm_exp(in_stack_00000048);
  std::shared_ptr<front::express::ExpressNode>::operator=
            ((shared_ptr<front::express::ExpressNode> *)in_stack_fffffffffffffec0,
             (shared_ptr<front::express::ExpressNode> *)in_stack_fffffffffffffeb8);
  std::shared_ptr<front::express::ExpressNode>::~shared_ptr
            ((shared_ptr<front::express::ExpressNode> *)0x2ad929);
  match_one_word(in_stack_00000030,in_stack_0000002c);
  peVar1 = std::
           __shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x2ad947);
  if (peVar1->_type == CNS) {
    std::__shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->((__shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x2ad959);
    std::variant<int,int,std::__cxx11::string>::emplace<0ul,int&>
              (in_stack_fffffffffffffec0,(int *)in_stack_fffffffffffffeb8);
  }
  else {
    std::__shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->((__shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x2ad997);
    std::variant<int,int,std::__cxx11::string>::operator=
              (in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
  }
  peVar1 = std::
           __shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x2ad9bc);
  if (peVar1->_operation == PTR) {
    this_00 = (variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)(in_RDI + 0x80);
    std::__shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->((__shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x2ad9e1);
    std::variant<int,std::__cxx11::string>::
    variant<std::__cxx11::string&,void,void,std::__cxx11::string,void>
              ((variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)this_00,in_stack_fffffffffffffeb8);
    std::
    variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::variant(this_00,(variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)in_stack_fffffffffffffeb8);
    irGenerator::irGenerator::ir_store(in_stack_00000010,in_stack_00000008,unaff_retaddr);
    std::
    variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~variant((variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)0x2ada2e);
    std::
    variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~variant((variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)0x2ada3b);
  }
  else {
    __t = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(in_RDI + 0x80);
    std::__shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->((__shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x2adaa0);
    std::variant<int,std::__cxx11::string>::
    variant<std::__cxx11::string&,void,void,std::__cxx11::string,void>
              ((variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)in_stack_fffffffffffffec0,__t);
    std::
    variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::variant(in_stack_fffffffffffffec0,
              (variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)__t);
    irGenerator::irGenerator::ir_assign(in_stack_00000010,in_stack_00000008,unaff_retaddr);
    std::
    variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~variant((variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)0x2adae6);
    std::
    variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~variant((variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)0x2adaf0);
  }
  std::
  variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~variant((variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)0x2adb3f);
  std::shared_ptr<front::express::ExpressNode>::~shared_ptr
            ((shared_ptr<front::express::ExpressNode> *)0x2adb4c);
  std::shared_ptr<front::express::ExpressNode>::~shared_ptr
            ((shared_ptr<front::express::ExpressNode> *)0x2adb59);
  return;
}

Assistant:

void SyntaxAnalyze::gm_assign_stmt() {
  SharedExNdPtr lVal;
  SharedExNdPtr rVal;
  RightVal rightValue;

  lVal = gm_l_val(ValueMode::left);
  match_one_word(Token::ASSIGN);
  rVal = gm_exp();
  match_one_word(Token::SEMICN);

  if (rVal->_type == NodeType::CNS) {
    rightValue.emplace<0>(rVal->_value);
  } else {
    rightValue = rVal->_name;
  }
  if (lVal->_operation == OperationType::PTR) {
    irGenerator.ir_store(lVal->_name, rightValue);
  } else {
    irGenerator.ir_assign(lVal->_name, rightValue);
  }
}